

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict acc;
  fe_t_conflict t25;
  fe_t_conflict t23;
  uint64_t auStack_98 [4];
  uint64_t local_78 [4];
  uint64_t local_58 [5];
  
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(auStack_98,t1);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(local_78,t1,auStack_98);
  iVar1 = 9;
  do {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(local_78,local_78,auStack_98);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(local_58,local_78,auStack_98);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(local_78,local_58,auStack_98);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(auStack_98,t1);
  iVar1 = 0xf7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(auStack_98,auStack_98);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(auStack_98,auStack_98,local_78);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(auStack_98,auStack_98);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(output,auStack_98,local_58);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_inv(fe_t output,
                                                            const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t23, t25;

    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t1, acc);
    for (i = 0; i < 9; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t23, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t25, t23, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, t1);
    for (i = 0; i < 247; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(output, acc, t23);
}